

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimedResult.cpp
# Opt level: O2

void __thiscall
oout::TimedResult::TimedResult
          (TimedResult *this,shared_ptr<const_oout::Result> *result,nanoseconds *duration)

{
  (this->super_Result)._vptr_Result = (_func_int **)&PTR__TimedResult_001cd940;
  std::__shared_ptr<const_oout::Result,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->result).super___shared_ptr<const_oout::Result,_(__gnu_cxx::_Lock_policy)2>,
             &result->super___shared_ptr<const_oout::Result,_(__gnu_cxx::_Lock_policy)2>);
  (this->duration).__r = duration->__r;
  return;
}

Assistant:

TimedResult::TimedResult(
	const shared_ptr<const Result> &result,
	const chrono::nanoseconds &duration
) : result(result), duration(duration)
{
}